

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDEdge * __thiscall ON_SubDHeap::EdgeFromId(ON_SubDHeap *this,uint edge_id)

{
  ON_SubDEdge *pOVar1;
  
  if ((((1 < edge_id + 1) &&
       (pOVar1 = (ON_SubDEdge *)
                 ON_FixedSizePool::ElementFromId(&this->m_fspe,m_offset_edge_id,edge_id),
       pOVar1 != (ON_SubDEdge *)0x0)) && ((pOVar1->super_ON_SubDComponentBase).m_id == edge_id)) &&
     ((pOVar1->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
    return pOVar1;
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDEdge *)0x0;
}

Assistant:

const class ON_SubDEdge* ON_SubDHeap::EdgeFromId(
  unsigned int edge_id
  ) const
{
  if ( 0 == edge_id || ON_UNSET_UINT_INDEX == edge_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const class ON_SubDEdge* edge = (const class ON_SubDEdge*)m_fspe.ElementFromId(ON_SubDHeap::m_offset_edge_id,edge_id);
  if ( nullptr == edge || edge_id != edge->m_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( ON_UNSET_UINT_INDEX == edge->ArchiveId() )
    return ON_SUBD_RETURN_ERROR(nullptr);
  return edge;
}